

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>::SampledGrid
          (SampledGrid<pbrt::RGBUnboundedSpectrum> *this,span<const_pbrt::RGBUnboundedSpectrum> v,
          int nx,int ny,int nz,Allocator alloc)

{
  int va;
  size_t vb;
  
  vb = (size_t)alloc.memoryResource;
  pstd::
  vector<pbrt::RGBUnboundedSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>>::
  vector<pbrt::RGBUnboundedSpectrum_const*>
            ((vector<pbrt::RGBUnboundedSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>>
              *)this,v.ptr,v.ptr + v.n,(polymorphic_allocator<pbrt::RGBUnboundedSpectrum> *)&vb);
  this->nx = nx;
  this->ny = ny;
  this->nz = nz;
  va = ny * nx * nz;
  vb = (this->values).nStored;
  if (vb == (long)va) {
    return;
  }
  LogFatal<char_const(&)[13],char_const(&)[14],char_const(&)[13],int&,char_const(&)[14],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers.h"
             ,0x316,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nx * ny * nz",
             (char (*) [14])"values.size()",(char (*) [13])"nx * ny * nz",&va,
             (char (*) [14])"values.size()",(unsigned_long *)&vb);
}

Assistant:

SampledGrid(pstd::span<const T> v, int nx, int ny, int nz, Allocator alloc)
        : values(v.begin(), v.end(), alloc), nx(nx), ny(ny), nz(nz) {
        CHECK_EQ(nx * ny * nz, values.size());
    }